

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

Expression
dynet::expr::detail::
f<dynet::Sum,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
          (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *xs)

{
  bool bVar1;
  pointer pEVar2;
  size_type __n;
  reference this;
  int iVar3;
  undefined8 extraout_RDX;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *in_RSI;
  Expression *in_RDI;
  Expression EVar4;
  const_iterator xi;
  int i;
  vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> xis;
  ComputationGraph *pg;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
  *in_stack_ffffffffffffff68;
  VariableIndex *in_stack_ffffffffffffff70;
  Expression *this_00;
  vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> *this_01;
  __normal_iterator<const_dynet::expr::Expression_*,_std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>
  local_58;
  int iVar5;
  undefined4 in_stack_ffffffffffffffb4;
  ComputationGraph *in_stack_ffffffffffffffb8;
  undefined1 local_39 [25];
  __normal_iterator<const_dynet::expr::Expression_*,_std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>
  local_20;
  ComputationGraph *local_18;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *local_10;
  
  this_00 = in_RDI;
  local_10 = in_RSI;
  local_20._M_current =
       (Expression *)
       std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::begin
                 (in_stack_ffffffffffffff68);
  pEVar2 = __gnu_cxx::
           __normal_iterator<const_dynet::expr::Expression_*,_std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>
           ::operator->(&local_20);
  local_18 = pEVar2->pg;
  __n = std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::size
                  (local_10);
  this_01 = (vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> *)local_39;
  std::allocator<dynet::VariableIndex>::allocator((allocator<dynet::VariableIndex> *)0x173aec);
  std::vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>::vector
            (this_01,__n,(allocator_type *)this_00);
  std::allocator<dynet::VariableIndex>::~allocator((allocator<dynet::VariableIndex> *)0x173b0c);
  iVar5 = 0;
  local_58._M_current =
       (Expression *)
       std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::begin
                 (in_stack_ffffffffffffff68);
  while( true ) {
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::end
              (in_stack_ffffffffffffff68);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_dynet::expr::Expression_*,_std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<const_dynet::expr::Expression_*,_std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_dynet::expr::Expression_*,_std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>
             ::operator->(&local_58);
    in_stack_ffffffffffffff70 = &pEVar2->i;
    iVar3 = iVar5 + 1;
    this = std::vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>::operator[]
                     ((vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> *)
                      (local_39 + 1),(long)iVar5);
    VariableIndex::operator=(this,in_stack_ffffffffffffff70);
    __gnu_cxx::
    __normal_iterator<const_dynet::expr::Expression_*,_std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>
    ::operator++(&local_58);
    iVar5 = iVar3;
  }
  ComputationGraph::
  add_function<dynet::Sum,std::vector<dynet::VariableIndex,std::allocator<dynet::VariableIndex>>>
            (in_stack_ffffffffffffffb8,
             (vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,iVar5));
  Expression::Expression(this_00,(ComputationGraph *)in_RDI,in_stack_ffffffffffffff70);
  std::vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>::~vector
            ((vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> *)this_00);
  EVar4._8_8_ = extraout_RDX;
  EVar4.pg = (ComputationGraph *)this_00;
  return EVar4;
}

Assistant:

Expression f(const T& xs) {
    ComputationGraph *pg = xs.begin()->pg;
    std::vector<VariableIndex> xis(xs.size());
    int i = 0;
    for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
    return Expression(pg, pg->add_function<F>(xis));
  }